

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O0

FilterPropagateResult
duckdb::CheckParquetFloatFilter(ColumnReader *reader,Statistics *pq_col_stats,TableFilter *filter)

{
  FilterPropagateResult FVar1;
  type pBVar2;
  long *in_RDX;
  ColumnReader *in_RDI;
  FilterPropagateResult prune;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
  min_max_stats;
  FilterPropagateResult nan_prune;
  Value nan_value;
  BaseStatistics nan_stats;
  LogicalType *type;
  Statistics *in_stack_00000178;
  ParquetColumnSchema *in_stack_00000180;
  LogicalType *in_stack_00000188;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  Value local_128 [64];
  LogicalType local_e8 [80];
  LogicalType local_98 [24];
  BaseStatistics local_80 [88];
  LogicalType *local_28;
  long *local_20;
  ColumnReader *local_10;
  FilterPropagateResult local_1;
  
  local_20 = in_RDX;
  local_10 = in_RDI;
  local_28 = ColumnReader::Type(in_RDI);
  duckdb::LogicalType::LogicalType(local_98,local_28);
  duckdb::NumericStats::CreateUnknown(local_80,local_98);
  duckdb::LogicalType::~LogicalType(local_98);
  duckdb::Value::Value(local_128,"nan");
  duckdb::Value::DefaultCastAs(local_e8,SUB81(local_128,0));
  duckdb::Value::~Value(local_128);
  duckdb::NumericStats::SetMin(local_80,(Value *)local_e8);
  duckdb::NumericStats::SetMax(local_80,(Value *)local_e8);
  FVar1 = (**(code **)(*local_20 + 0x10))(local_20,local_80);
  ColumnReader::Type(local_10);
  ColumnReader::Schema(local_10);
  ParquetStatisticsUtils::CreateNumericStats(in_stack_00000188,in_stack_00000180,in_stack_00000178);
  pBVar2 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
           operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                      *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  local_1 = (**(code **)(*local_20 + 0x10))(local_20,pBVar2);
  if ((local_1 == NO_PRUNING_POSSIBLE) || (FVar1 == NO_PRUNING_POSSIBLE)) {
    local_1 = NO_PRUNING_POSSIBLE;
  }
  else if (local_1 != FVar1) {
    local_1 = NO_PRUNING_POSSIBLE;
  }
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::~unique_ptr
            ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              *)0x6a05a4);
  duckdb::Value::~Value((Value *)local_e8);
  duckdb::BaseStatistics::~BaseStatistics(local_80);
  return local_1;
}

Assistant:

static FilterPropagateResult CheckParquetFloatFilter(ColumnReader &reader, const Statistics &pq_col_stats,
                                                     TableFilter &filter) {
	// floating point values can have values in the [min, max] domain AND nan values
	// check both stats against the filter
	auto &type = reader.Type();
	auto nan_stats = NumericStats::CreateUnknown(type);
	auto nan_value = Value("nan").DefaultCastAs(type);
	NumericStats::SetMin(nan_stats, nan_value);
	NumericStats::SetMax(nan_stats, nan_value);
	auto nan_prune = filter.CheckStatistics(nan_stats);

	auto min_max_stats = ParquetStatisticsUtils::CreateNumericStats(reader.Type(), reader.Schema(), pq_col_stats);
	auto prune = filter.CheckStatistics(*min_max_stats);

	// if EITHER of them cannot be pruned - we cannot prune
	if (prune == FilterPropagateResult::NO_PRUNING_POSSIBLE ||
	    nan_prune == FilterPropagateResult::NO_PRUNING_POSSIBLE) {
		return FilterPropagateResult::NO_PRUNING_POSSIBLE;
	}
	// if both are the same we can return that value
	if (prune == nan_prune) {
		return prune;
	}
	// if they are different we need to return that we cannot prune
	// e.g. prune = always false, nan_prune = always true -> we don't know
	return FilterPropagateResult::NO_PRUNING_POSSIBLE;
}